

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  anon_union_4_2_77b30072 aVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  Mat *this_00;
  uint uVar6;
  anon_union_4_2_77b30072 flag_struct;
  uint local_4a0;
  uint local_49c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  Mat m;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  int local_404;
  size_t local_400;
  
  if (type != 1) {
    if (type != 0) {
      pcVar5 = "ModelBin load type %d not implemented\n";
      uVar4 = (ulong)(uint)type;
LAB_0011ad2f:
      fprintf(_stderr,pcVar5,uVar4);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      return __return_storage_ptr__;
    }
    uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,&flag_struct,4);
    aVar1 = flag_struct;
    if (uVar2 != 4) {
      pcVar5 = "ModelBin read flag_struct failed %d\n";
      uVar4 = (ulong)uVar2;
      goto LAB_0011ad2f;
    }
    if (flag_struct.tag == 0x2c056) {
      Mat::Mat((Mat *)&float16_weights,w,4,(Allocator *)0x0);
      if ((float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
         ((long)local_404 * local_400 != 0)) {
        uVar2 = (*this->dr->_vptr_DataReader[3])
                          (this->dr,float16_weights.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(ulong)(uint)(w << 2))
        ;
        goto LAB_0011ab0c;
      }
      goto LAB_0011ab15;
    }
    if (flag_struct.tag == 0xd4b38) {
      uVar4 = (long)w + 3;
      uVar6 = (uint)uVar4 & 0xfffffffc;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)&float16_weights,
                 (long)(int)uVar6);
      uVar2 = (*this->dr->_vptr_DataReader[3])
                        (this->dr,float16_weights.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start,uVar4 & 0xfffffffc);
      if (uVar2 == uVar6) {
        Mat::Mat(__return_storage_ptr__,w,1,(Allocator *)0x0);
        if ((__return_storage_ptr__->data != (void *)0x0) &&
           ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
          memcpy(__return_storage_ptr__->data,
                 float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                 ._M_impl.super__Vector_impl_data._M_start,(long)w);
        }
      }
      else {
        fprintf(_stderr,"ModelBin read int8_weights failed %d\n",(ulong)uVar2);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
      std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&float16_weights);
      return __return_storage_ptr__;
    }
    if (flag_struct.tag == 0x1306b47) {
      uVar4 = (long)w * 2 + 3;
      uVar6 = (uint)uVar4 & 0xfffffffc;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&float16_weights,(long)(int)uVar6);
      uVar2 = (*this->dr->_vptr_DataReader[3])
                        (this->dr,float16_weights.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start,uVar4 & 0xfffffffc);
      if (uVar2 == uVar6) {
        Mat::from_float16(__return_storage_ptr__,
                          float16_weights.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start,w);
      }
      else {
        fprintf(_stderr,"ModelBin read float16_weights failed %d\n",(ulong)uVar2);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&float16_weights.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      return __return_storage_ptr__;
    }
    uVar2 = flag_struct.tag >> 8;
    local_4a0 = flag_struct.tag >> 0x10 & 0xff;
    local_49c = flag_struct.tag >> 0x18;
    Mat::Mat(&m,w,4,(Allocator *)0x0);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
LAB_0011ae84:
      Mat::Mat(__return_storage_ptr__,&m);
    }
    else {
      if ((uVar2 & 0xff) + (aVar1.tag & 0xff) + local_4a0 == 0 && local_49c == 0) {
        if ((flag_struct.field_0.f0 == '\0') &&
           (uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,m.data,(ulong)(uint)(w << 2)),
           uVar2 != w << 2)) {
          pcVar5 = "ModelBin read weight_data failed %d\n";
          goto LAB_0011ae2c;
        }
        goto LAB_0011ae84;
      }
      uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,&float16_weights,0x400);
      if (uVar2 == 0x400) {
        uVar6 = w + 3U & 0xfffffffc;
        index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&index_array,(long)(int)uVar6);
        uVar2 = (*this->dr->_vptr_DataReader[3])
                          (this->dr,index_array.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(ulong)uVar6);
        if (uVar2 == uVar6) {
          uVar3 = 0;
          uVar4 = (ulong)(uint)w;
          if (w < 1) {
            uVar4 = uVar3;
          }
          for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
            *(undefined4 *)((long)m.data + uVar3 * 4) =
                 *(undefined4 *)
                  ((long)&float16_weights.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                  (ulong)index_array.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar3] * 4);
          }
        }
        else {
          fprintf(_stderr,"ModelBin read index_array failed %d\n",(ulong)uVar2);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        if (uVar2 == uVar6) goto LAB_0011ae84;
      }
      else {
        pcVar5 = "ModelBin read quantization_value failed %d\n";
LAB_0011ae2c:
        fprintf(_stderr,pcVar5,(ulong)uVar2);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
    }
    this_00 = &m;
    goto LAB_0011ab27;
  }
  Mat::Mat((Mat *)&float16_weights,w,4,(Allocator *)0x0);
  if ((float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x0) || ((long)local_404 * local_400 == 0)) {
LAB_0011ab15:
    Mat::Mat(__return_storage_ptr__,(Mat *)&float16_weights);
  }
  else {
    uVar2 = (*this->dr->_vptr_DataReader[3])
                      (this->dr,float16_weights.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start,(ulong)(uint)(w << 2));
LAB_0011ab0c:
    if (uVar2 == w << 2) goto LAB_0011ab15;
    fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)uVar2);
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  this_00 = (Mat *)&float16_weights;
LAB_0011ab27:
  Mat::~Mat(this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != (int)sizeof(flag_struct))
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = dr.read(m, w * sizeof(float));
        if (nread != w * (int)sizeof(float))
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}